

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_mirjit.c
# Opt level: O0

int raviV_initjit(lua_State *L)

{
  global_State *pgVar1;
  ravi_State *prVar2;
  MIR_context_t pMVar3;
  ravi_State *jit;
  global_State *G;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  if (pgVar1->ravi_state == (ravi_State *)0x0) {
    prVar2 = (ravi_State *)calloc(1,0x88);
    *(ushort *)&prVar2->field_0x10 = *(ushort *)&prVar2->field_0x10 & 0xfff7;
    *(ushort *)&prVar2->field_0x10 = *(ushort *)&prVar2->field_0x10 & 0xffef | 0x10;
    prVar2->min_code_size_ = 0x96;
    prVar2->min_exec_count_ = 0x32;
    *(ushort *)&prVar2->field_0x10 = *(ushort *)&prVar2->field_0x10 & 0xff1f | 0x40;
    pMVar3 = MIR_init();
    prVar2->jit = pMVar3;
    pgVar1->ravi_state = prVar2;
    L_local._4_4_ = 0;
  }
  else {
    L_local._4_4_ = -1;
  }
  return L_local._4_4_;
}

Assistant:

int raviV_initjit(struct lua_State *L) {
  global_State *G = G(L);
  if (G->ravi_state != NULL)
    return -1;
  ravi_State *jit = (ravi_State *)calloc(1, sizeof(ravi_State));
  jit->auto_ = 0;
  jit->enabled_ = 1;
  jit->min_code_size_ = 150;
  jit->min_exec_count_ = 50;
  jit->opt_level_ = 2;
  // The parameter true means we will be dumping stuff as we compile
  jit->jit = MIR_init();
  G->ravi_state = jit;
  return 0;
}